

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucket.cpp
# Opt level: O3

ssize_t __thiscall bucket::read(bucket *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer piVar1;
  pointer extraout_RAX;
  pointer extraout_RAX_00;
  pointer piVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf_00;
  void *extraout_RDX_02;
  undefined4 in_register_00000034;
  char *pcVar3;
  pointer piVar4;
  long lVar5;
  allocator_type local_39;
  vector<index,_std::allocator<index>_> local_38;
  
  pcVar3 = (char *)CONCAT44(in_register_00000034,__fd);
  std::istream::seekg(pcVar3,0,0);
  std::istream::read(pcVar3,(long)this);
  std::istream::read(pcVar3,(long)&this->size);
  std::istream::read(pcVar3,(long)&this->depth);
  std::vector<index,_std::allocator<index>_>::vector(&local_38,(ulong)this->size,&local_39);
  piVar2 = local_38.super__Vector_base<index,_std::allocator<index>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  piVar4 = (this->indices).super__Vector_base<index,_std::allocator<index>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (this->indices).super__Vector_base<index,_std::allocator<index>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->indices).super__Vector_base<index,_std::allocator<index>_>._M_impl.super__Vector_impl_data.
  _M_start = local_38.super__Vector_base<index,_std::allocator<index>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->indices).super__Vector_base<index,_std::allocator<index>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_38.super__Vector_base<index,_std::allocator<index>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (this->indices).super__Vector_base<index,_std::allocator<index>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_38.super__Vector_base<index,_std::allocator<index>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_38.super__Vector_base<index,_std::allocator<index>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<index,_std::allocator<index>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<index,_std::allocator<index>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __buf_00 = extraout_RDX;
  if (piVar4 != (pointer)0x0) {
    operator_delete(piVar4,(long)piVar1 - (long)piVar4);
    piVar2 = extraout_RAX;
    __buf_00 = extraout_RDX_00;
    if (local_38.super__Vector_base<index,_std::allocator<index>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<index,_std::allocator<index>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<index,_std::allocator<index>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<index,_std::allocator<index>_>._M_impl.
                            super__Vector_impl_data._M_start);
      piVar2 = extraout_RAX_00;
      __buf_00 = extraout_RDX_01;
    }
  }
  if (this->size != '\0') {
    lVar5 = 0;
    piVar4 = (pointer)0x0;
    do {
      index::read((index *)((long)&((this->indices).
                                    super__Vector_base<index,_std::allocator<index>_>._M_impl.
                                    super__Vector_impl_data._M_start)->file_id + lVar5),__fd,
                  __buf_00,__nbytes);
      piVar4 = (pointer)((long)&piVar4->file_id + 1);
      piVar2 = (pointer)(ulong)this->size;
      lVar5 = lVar5 + 0xc;
      __buf_00 = extraout_RDX_02;
    } while (piVar4 < piVar2);
  }
  return (ssize_t)piVar2;
}

Assistant:

void bucket::read(std::fstream &stream) {
    stream.seekg(0);

    stream.read((char *) &id, BUCKET_ID);
    stream.read((char *) &size, BUCKET_SIZE_FIELD);
    stream.read((char *) &depth, DEPTHS);

    indices = std::vector<index>(size);

    for (int i = 0; i < size; ++i) {
        indices[i].read(stream);
    }
}